

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::ReferenceResolver::_store_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  ro_substr pattern;
  ro_substr pattern_00;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  bool bVar1;
  int iVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  size_t sVar5;
  ReferenceResolver *in_RSI;
  size_t in_RDI;
  size_t ch;
  size_t ich;
  size_t in_stack_fffffffffffffc08;
  Tree *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  Tree *in_stack_fffffffffffffc20;
  basic_substring<const_char> *in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  Tree *in_stack_fffffffffffffc60;
  Tree *in_stack_fffffffffffffc68;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  basic_substring<const_char> *in_stack_fffffffffffffc88;
  size_t in_stack_fffffffffffffc90;
  size_t local_368;
  Tree *pTStack_360;
  size_t local_310;
  Tree *pTStack_308;
  char *local_300;
  Tree *pTStack_2f8;
  size_t local_2b8;
  Tree *pTStack_2b0;
  char *local_2a8;
  Tree *pTStack_2a0;
  size_t local_250;
  Tree *pTStack_248;
  char *local_240;
  Tree *pTStack_238;
  basic_substring<const_char> *local_230;
  size_t local_1e8;
  Tree *pTStack_1e0;
  char *local_1d8;
  Tree *pTStack_1d0;
  size_t in_stack_fffffffffffffe40;
  
  pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
  if ((((pNVar4->m_type).type & KEYREF) == NOTYPE) &&
     (pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI),
     ((pNVar4->m_type).type & VALREF) == NOTYPE)) {
    pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
    if (((pNVar4->m_type).type & KEY) == NOTYPE) goto LAB_003d9041;
    Tree::key(in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
    iVar2 = basic_substring<const_char>::compare
                      (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78
                      );
    if (iVar2 != 0) goto LAB_003d9041;
  }
  pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
  if (((pNVar4->m_type).type & SEQ) != NOTYPE) {
    sVar5 = Tree::first_child(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    while (sVar5 != 0xffffffffffffffff) {
      sVar5 = Tree::num_children(in_stack_fffffffffffffc20,(size_t)in_stack_fffffffffffffc18);
      if (sVar5 != 0) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        Location::Location((Location *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                           (size_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        loc.super_LineCol.line = in_stack_fffffffffffffc78;
        loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffc70;
        loc.super_LineCol.col = (size_t)in_stack_fffffffffffffc80;
        loc.name.str = (char *)in_stack_fffffffffffffc88;
        loc.name.len = in_stack_fffffffffffffc90;
        in_stack_fffffffffffffc08 = local_1e8;
        in_stack_fffffffffffffc10 = pTStack_1e0;
        in_stack_fffffffffffffc18 = local_1d8;
        in_stack_fffffffffffffc20 = pTStack_1d0;
        error<40ul>((char (*) [40])in_stack_fffffffffffffc60,loc);
      }
      Tree::next_sibling(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
                (in_stack_fffffffffffffc70,(refdata *)in_stack_fffffffffffffc68);
      sVar5 = Tree::next_sibling(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    }
    return;
  }
  pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
  if (((pNVar4->m_type).type & KEYREF) != NOTYPE) {
    Tree::key(in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
    iVar2 = basic_substring<const_char>::compare
                      (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78
                      );
    if (iVar2 != 0) {
      pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
      if (((pNVar4->m_type).type & KEY) != NOTYPE) {
        Tree::key(in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
        Tree::key_ref(in_stack_fffffffffffffc60,in_RDI);
        pattern.len._0_7_ = in_stack_fffffffffffffc38;
        pattern.str = (char *)in_stack_fffffffffffffc30;
        pattern.len._7_1_ = in_stack_fffffffffffffc3f;
        bVar1 = basic_substring<const_char>::ends_with(in_stack_fffffffffffffc28,pattern);
        if (!bVar1) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          Location::Location((Location *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                             (size_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          loc_00.super_LineCol.line = in_stack_fffffffffffffc78;
          loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffc70;
          loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffc80;
          loc_00.name.str = (char *)in_stack_fffffffffffffc88;
          loc_00.name.len = in_stack_fffffffffffffc90;
          error<69ul>((char (*) [69])in_stack_fffffffffffffc60,loc_00);
          in_stack_fffffffffffffc08 = local_250;
          in_stack_fffffffffffffc10 = pTStack_248;
          in_stack_fffffffffffffc18 = local_240;
          in_stack_fffffffffffffc20 = pTStack_238;
          in_stack_fffffffffffffc28 = local_230;
        }
      }
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
                (in_stack_fffffffffffffc70,(refdata *)in_stack_fffffffffffffc68);
    }
  }
  pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
  if (((pNVar4->m_type).type & VALREF) != NOTYPE) {
    pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
    if (((pNVar4->m_type).type & VAL) != NOTYPE) {
      Tree::val(in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      Tree::val_ref((Tree *)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
      pattern_00.len._0_7_ = in_stack_fffffffffffffc38;
      pattern_00.str = (char *)in_stack_fffffffffffffc30;
      pattern_00.len._7_1_ = in_stack_fffffffffffffc3f;
      bVar1 = basic_substring<const_char>::ends_with(in_stack_fffffffffffffc28,pattern_00);
      if (!bVar1) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        Location::Location((Location *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                           (size_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        loc_01.super_LineCol.line = in_stack_fffffffffffffc78;
        loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffc70;
        loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffc80;
        loc_01.name.str = (char *)in_stack_fffffffffffffc88;
        loc_01.name.len = in_stack_fffffffffffffc90;
        error<69ul>((char (*) [69])in_stack_fffffffffffffc60,loc_01);
        in_stack_fffffffffffffc08 = local_2b8;
        in_stack_fffffffffffffc10 = pTStack_2b0;
        in_stack_fffffffffffffc18 = local_2a8;
        in_stack_fffffffffffffc20 = pTStack_2a0;
      }
    }
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
              (in_stack_fffffffffffffc70,(refdata *)in_stack_fffffffffffffc68);
  }
LAB_003d9041:
  pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
  if (((pNVar4->m_type).type & (KEYANCH|KEY)) == (KEYANCH|KEY)) {
    pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
    if (((pNVar4->m_type).type & KEY) == NOTYPE) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location((Location *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                         (size_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      loc_02.super_LineCol.line = in_stack_fffffffffffffc78;
      loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffc70;
      loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffc80;
      loc_02.name.str = (char *)in_stack_fffffffffffffc88;
      loc_02.name.len = in_stack_fffffffffffffc90;
      error<28ul>((char (*) [28])in_stack_fffffffffffffc60,loc_02);
      in_stack_fffffffffffffc08 = local_310;
      in_stack_fffffffffffffc10 = pTStack_308;
      in_stack_fffffffffffffc18 = local_300;
      in_stack_fffffffffffffc20 = pTStack_2f8;
    }
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
              (in_stack_fffffffffffffc70,(refdata *)in_stack_fffffffffffffc68);
  }
  pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
  bVar1 = false;
  if (((pNVar4->m_type).type & VALANCH) != NOTYPE) {
    bVar1 = ((pNVar4->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
  }
  if (bVar1) {
    pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI);
    if ((((pNVar4->m_type).type & VAL) == NOTYPE) &&
       (pNVar4 = Tree::_p(in_stack_fffffffffffffc60,in_RDI),
       ((pNVar4->m_type).type & (STREAM|MAP)) == NOTYPE)) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location((Location *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                         (size_t)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      loc_03.super_LineCol.line = in_stack_fffffffffffffc78;
      loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffffc70;
      loc_03.super_LineCol.col = (size_t)in_stack_fffffffffffffc80;
      loc_03.name.str = (char *)in_stack_fffffffffffffc88;
      loc_03.name.len = in_stack_fffffffffffffc90;
      error<50ul>((char (*) [50])in_stack_fffffffffffffc60,loc_03);
      in_stack_fffffffffffffc08 = local_368;
      in_stack_fffffffffffffc10 = pTStack_360;
    }
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
              ((stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)in_RSI,(refdata *)0x200);
  }
  sVar5 = Tree::first_child(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  while (sVar5 != 0xffffffffffffffff) {
    _store_anchors_and_refs(in_RSI,in_stack_fffffffffffffe40);
    sVar5 = Tree::next_sibling(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  }
  return;
}

Assistant:

void _store_anchors_and_refs(size_t n)
    {
        if(t->is_key_ref(n) || t->is_val_ref(n) || (t->has_key(n) && t->key(n) == "<<"))
        {
            if(t->is_seq(n))
            {
                // for merging multiple inheritance targets
                //   <<: [ *CENTER, *BIG ]
                for(size_t ich = t->first_child(n); ich != NONE; ich = t->next_sibling(ich))
                {
                    RYML_ASSERT(t->num_children(ich) == 0);
                    refs.push({VALREF, ich, npos, npos, n, t->next_sibling(n)});
                }
                return;
            }
            if(t->is_key_ref(n) && t->key(n) != "<<") // insert key refs BEFORE inserting val refs
            {
                RYML_CHECK((!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n)));
                refs.push({KEYREF, n, npos, npos, NONE, NONE});
            }
            if(t->is_val_ref(n))
            {
                RYML_CHECK((!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n)));
                refs.push({VALREF, n, npos, npos, NONE, NONE});
            }
        }
        if(t->has_key_anchor(n))
        {
            RYML_CHECK(t->has_key(n));
            refs.push({KEYANCH, n, npos, npos, NONE, NONE});
        }
        if(t->has_val_anchor(n))
        {
            RYML_CHECK(t->has_val(n) || t->is_container(n));
            refs.push({VALANCH, n, npos, npos, NONE, NONE});
        }
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
        {
            _store_anchors_and_refs(ch);
        }
    }